

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O1

void __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>
::multiply_source_and_add_to
          (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>
           *this,Field_element *coefficient,Index sourceColumnIndex,Index targetColumnIndex)

{
  ID_index IVar1;
  Dimension DVar2;
  mapped_type mVar3;
  bool bVar4;
  mapped_type *targetColumn;
  mapped_type *source;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  ID_index pivot;
  anon_class_1_0_00000001 local_40;
  anon_class_1_0_00000001 local_3f;
  anon_class_1_0_00000001 local_3e;
  anon_class_1_0_00000001 local_3d;
  ID_index local_3c;
  anon_class_8_1_e4bd5e45 local_38;
  
  local_38.targetColumn._0_4_ = targetColumnIndex;
  targetColumn = std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       *)&this->matrix_,(key_type *)&local_38);
  local_3c = (targetColumn->super_Chain_column_option).pivot_;
  local_38.targetColumn._0_4_ = sourceColumnIndex;
  source = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&this->matrix_,(key_type *)&local_38);
  if (*coefficient == true) {
    local_38.targetColumn = targetColumn;
    bVar4 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false>>>const&,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persist___ue,(Gudhi::persistence_matrix::Column_types)7,true,false,false>>__Matrix_column_tag_1u>_false>___1_>
                      (source,targetColumn,&local_3d,&local_38,&local_3e,&local_3f,&local_40);
    if (bVar4) {
      IVar1 = (targetColumn->super_Chain_column_option).pivot_;
      (targetColumn->super_Chain_column_option).pivot_ = (source->super_Chain_column_option).pivot_;
      (source->super_Chain_column_option).pivot_ = IVar1;
      DVar2 = (targetColumn->super_Column_dimension_option).dim_;
      (targetColumn->super_Column_dimension_option).dim_ =
           (source->super_Column_dimension_option).dim_;
      (source->super_Column_dimension_option).dim_ = DVar2;
    }
  }
  if (local_3c != (targetColumn->super_Chain_column_option).pivot_) {
    pmVar5 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)&this->pivotToColumnIndex_,&local_3c);
    local_38.targetColumn._0_4_ = (targetColumn->super_Chain_column_option).pivot_;
    pmVar6 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)&this->pivotToColumnIndex_,(key_type *)&local_38);
    mVar3 = *pmVar5;
    *pmVar5 = *pmVar6;
    *pmVar6 = mVar3;
  }
  return;
}

Assistant:

inline void Chain_matrix<Master_matrix>::multiply_source_and_add_to(const Field_element& coefficient,
                                                                    Index sourceColumnIndex,
                                                                    Index targetColumnIndex)
{
  auto& col = get_column(targetColumnIndex);
  _add_to(col, [&]() { col.multiply_source_and_add(get_column(sourceColumnIndex), coefficient); });
}